

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

ON_Color __thiscall ON_SectionStyle::HatchColor(ON_SectionStyle *this,bool print)

{
  anon_union_4_2_6147a14e_for_ON_Color_15 *local_30;
  bool print_local;
  ON_SectionStyle *this_local;
  
  if (this->m_private == (ON_SectionStylePrivate *)0x0) {
    this_local._4_4_ = ON_Color::UnsetColor.field_0;
  }
  else {
    if (print) {
      local_30 = &(this->m_private->m_hatch_print_color).field_0;
    }
    else {
      local_30 = &(this->m_private->m_hatch_color).field_0;
    }
    this_local._4_4_ = *local_30;
  }
  return (ON_Color)this_local._4_4_;
}

Assistant:

ON_Color ON_SectionStyle::HatchColor(bool print) const
{
  if (m_private)
    return print ? m_private->m_hatch_print_color : m_private->m_hatch_color;
  return ON_Color::UnsetColor;
}